

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool __thiscall
fmt::v10::format_facet<std::locale>::do_put
          (format_facet<std::locale> *this,appender out,loc_value val,format_specs<char> *specs)

{
  bool bVar1;
  loc_writer<char> local_90;
  format_specs<char> *local_20;
  format_specs<char> *specs_local;
  format_facet<std::locale> *this_local;
  appender out_local;
  
  local_90.out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_90.specs = specs;
  local_20 = specs;
  specs_local = (format_specs<char> *)this;
  this_local = (format_facet<std::locale> *)
               out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  std::__cxx11::string::string((string *)&local_90.sep,(string *)&this->separator_);
  std::__cxx11::string::string((string *)&local_90.grouping,(string *)&this->grouping_);
  std::__cxx11::string::string((string *)&local_90.decimal_point,(string *)&this->decimal_point_);
  bVar1 = loc_value::visit<fmt::v10::detail::loc_writer<char>>(&val,&local_90);
  v10::detail::loc_writer<char>::~loc_writer(&local_90);
  return bVar1;
}

Assistant:

FMT_API FMT_FUNC auto format_facet<std::locale>::do_put(
    appender out, loc_value val, const format_specs<>& specs) const -> bool {
  return val.visit(
      detail::loc_writer<>{out, specs, separator_, grouping_, decimal_point_});
}